

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NullTransport.cpp
# Opt level: O2

void __thiscall adios2::transport::NullTransport::NullTransport(NullTransport *this,Comm *comm)

{
  NullTransportImpl *pNVar1;
  allocator local_52;
  allocator local_51;
  string local_50;
  string local_30;
  
  std::__cxx11::string::string((string *)&local_30,"NULL",&local_51);
  std::__cxx11::string::string((string *)&local_50,"NULL",&local_52);
  Transport::Transport(&this->super_Transport,&local_30,&local_50,comm);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_30);
  (this->super_Transport)._vptr_Transport = (_func_int **)&PTR__NullTransport_00823a68;
  pNVar1 = (NullTransportImpl *)operator_new(0x18);
  pNVar1->IsOpen = false;
  pNVar1->CurPos = 0;
  pNVar1->Capacity = 0;
  (this->Impl)._M_t.
  super___uniq_ptr_impl<adios2::transport::NullTransport::NullTransportImpl,_std::default_delete<adios2::transport::NullTransport::NullTransportImpl>_>
  ._M_t.
  super__Tuple_impl<0UL,_adios2::transport::NullTransport::NullTransportImpl_*,_std::default_delete<adios2::transport::NullTransport::NullTransportImpl>_>
  .super__Head_base<0UL,_adios2::transport::NullTransport::NullTransportImpl_*,_false>._M_head_impl
       = pNVar1;
  return;
}

Assistant:

NullTransport::NullTransport(helper::Comm const &comm)
: Transport("NULL", "NULL", comm), Impl(new NullTransportImpl)
{
}